

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_false>_> __thiscall
immutable::rrb_details::execute_concat_plan<int,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_false>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  uint32_t uVar1;
  ref<immutable::rrb_details::internal_node<int,_false>_> *prVar2;
  internal_node<int,_false> *piVar3;
  leaf_node<int,_false> *plVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint32_t uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  ref<immutable::rrb_details::leaf_node<int,_false>_> old_node;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_node;
  ref<immutable::rrb_details::leaf_node<int,_false>_> old;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_88;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_80;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_78;
  ulong local_70;
  internal_node<int,_false> *local_68;
  ref<immutable::rrb_details::internal_node<int,_false>_> *local_60;
  ulong local_58;
  uint32_t local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  ulong local_40;
  rrb_details local_38 [8];
  
  local_60 = all;
  local_48 = node_size;
  piVar3 = internal_node_create<int,false>(slen);
  *(internal_node<int,_false> **)this = piVar3;
  if (piVar3 != (internal_node<int,_false> *)0x0) {
    piVar3->_ref_count = 1;
  }
  local_40 = (ulong)slen;
  local_68 = (internal_node<int,_false> *)this;
  if (shift == 6) {
    uVar12 = 0;
    uVar7 = 0;
    for (uVar6 = 0; uVar6 != local_40; uVar6 = uVar6 + 1) {
      uVar1 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(local_60);
      local_78.ptr = piVar3->child[uVar7].ptr;
      if (local_78.ptr != (internal_node<int,_false> *)0x0) {
        (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
      }
      if (uVar12 == 0) {
        plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_78);
        if (uVar1 != plVar4->len) goto LAB_0014623e;
        piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)local_68);
        ref<immutable::rrb_details::internal_node<int,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,false>> *)(piVar3->child + uVar6),
                   (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_78);
        uVar7 = uVar7 + 1;
        uVar12 = 0;
      }
      else {
LAB_0014623e:
        local_58 = uVar6;
        local_80.ptr = (internal_node<int,_false> *)leaf_node_create<int,false>(uVar1);
        if (local_80.ptr != (internal_node<int,_false> *)0x0) {
          (local_80.ptr)->_ref_count = 1;
        }
        uVar6 = 0;
        while( true ) {
          uVar8 = (uint)uVar6;
          uVar5 = uVar1 - uVar8;
          if (uVar1 < uVar8 || uVar5 == 0) break;
          piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(local_60);
          local_88.ptr = piVar3->child[uVar7].ptr;
          if (local_88.ptr != (internal_node<int,_false> *)0x0) {
            (local_88.ptr)->_ref_count = (local_88.ptr)->_ref_count + 1;
          }
          plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_88);
          if (uVar5 < plVar4->len - uVar12) {
            uVar11 = (ulong)uVar5;
            uVar8 = uVar12;
            while( true ) {
              bVar13 = uVar11 == 0;
              uVar11 = uVar11 - 1;
              if (bVar13) break;
              plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_88);
              iVar9 = plVar4->child[uVar8];
              plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_80);
              plVar4->child[uVar6] = iVar9;
              uVar6 = (ulong)((int)uVar6 + 1);
              uVar8 = uVar8 + 1;
            }
            uVar12 = uVar12 + uVar5;
            uVar5 = uVar1;
          }
          else {
            uVar11 = 0;
            local_70 = uVar6;
            while( true ) {
              plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_88);
              uVar10 = plVar4->len;
              plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_88);
              if (uVar10 - uVar12 <= uVar11) break;
              iVar9 = plVar4->child[uVar12 + (int)uVar11];
              plVar4 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_80);
              plVar4->child[(uint)((int)local_70 + (int)uVar11)] = iVar9;
              uVar11 = uVar11 + 1;
            }
            uVar5 = (uVar8 - uVar12) + plVar4->len;
            uVar7 = uVar7 + 1;
            uVar12 = 0;
          }
          uVar6 = (ulong)uVar5;
          release<int>((leaf_node<int,_false> *)local_88.ptr);
        }
        piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)local_68);
        uVar6 = local_58;
        ref<immutable::rrb_details::internal_node<int,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,false>> *)
                   (piVar3->child + local_58),
                   (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_80);
        release<int>((leaf_node<int,_false> *)local_80.ptr);
      }
      release<int>((leaf_node<int,_false> *)local_78.ptr);
    }
  }
  else {
    local_4c = shift - 6;
    iVar9 = 0;
    uVar11 = 0;
    for (uVar6 = 0; uVar6 != local_40; uVar6 = uVar6 + 1) {
      uVar1 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(local_60);
      local_78.ptr = piVar3->child[uVar11].ptr;
      if (local_78.ptr != (internal_node<int,_false> *)0x0) {
        (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
      }
      if (iVar9 == 0) {
        piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&local_78);
        if (uVar1 != piVar3->len) goto LAB_00146443;
        piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)local_68);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (piVar3->child + uVar6,&local_78);
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar9 = 0;
      }
      else {
LAB_00146443:
        local_70 = CONCAT44(local_70._4_4_,iVar9);
        local_58 = uVar6;
        local_80.ptr = internal_node_create<int,false>(uVar1);
        if (local_80.ptr != (internal_node<int,_false> *)0x0) {
          (local_80.ptr)->_ref_count = 1;
        }
        uVar10 = 0;
        while (uVar7 = uVar1 - uVar10, uVar10 <= uVar1 && uVar7 != 0) {
          piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(local_60);
          local_88.ptr = piVar3->child[uVar11].ptr;
          if (local_88.ptr != (internal_node<int,_false> *)0x0) {
            (local_88.ptr)->_ref_count = (local_88.ptr)->_ref_count + 1;
          }
          piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->(&local_88);
          uVar12 = (uint)local_70;
          if (uVar7 < piVar3->len - (uint)local_70) {
            uVar6 = (ulong)uVar7;
            while (bVar13 = uVar6 != 0, uVar6 = uVar6 - 1, bVar13) {
              piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                                 (&local_88);
              prVar2 = piVar3->child;
              piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                                 (&local_80);
              ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                        (piVar3->child + uVar10,prVar2 + uVar12);
              uVar10 = uVar10 + 1;
              uVar12 = uVar12 + 1;
            }
            local_70 = CONCAT44(local_70._4_4_,(uint)local_70 + uVar7);
            uVar10 = uVar1;
          }
          else {
            uVar6 = 0;
            while( true ) {
              piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                                 (&local_88);
              uVar7 = piVar3->len - (uint)local_70;
              piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                                 (&local_88);
              if (uVar7 <= uVar6) break;
              prVar2 = piVar3->child;
              piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                                 (&local_80);
              ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                        (piVar3->child + (uVar10 + (int)uVar6),prVar2 + (uVar12 + (int)uVar6));
              uVar6 = uVar6 + 1;
            }
            uVar10 = (uVar10 - (uint)local_70) + piVar3->len;
            uVar11 = (ulong)((int)uVar11 + 1);
            local_70 = local_70 & 0xffffffff00000000;
          }
          ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_88);
        }
        set_sizes<int,false,6>(local_38,&local_80,local_4c);
        uVar6 = local_58;
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)local_38);
        piVar3 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_false>_> *)local_68);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (piVar3->child + uVar6,&local_80);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_80);
        iVar9 = (uint)local_70;
      }
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_78);
    }
  }
  return (ref<immutable::rrb_details::internal_node<int,_false>_>)local_68;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }